

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::(anonymous_namespace)::SSLVersionTest_SSLClearSessionResumption_Test::
~SSLVersionTest_SSLClearSessionResumption_Test(SSLVersionTest_SSLClearSessionResumption_Test *this)

{
  anon_unknown_0::SSLVersionTest_SSLClearSessionResumption_Test::
  ~SSLVersionTest_SSLClearSessionResumption_Test
            ((SSLVersionTest_SSLClearSessionResumption_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(SSLVersionTest, SSLClearSessionResumption) {
  // Skip this for TLS 1.3. TLS 1.3's ticket mechanism is incompatible with this
  // API pattern.
  if (is_tls13()) {
    return;
  }

  shed_handshake_config_ = false;
  ASSERT_TRUE(Connect());

  EXPECT_FALSE(SSL_session_reused(client_.get()));
  EXPECT_FALSE(SSL_session_reused(server_.get()));

  // Reset everything.
  ASSERT_TRUE(SSL_clear(client_.get()));
  ASSERT_TRUE(SSL_clear(server_.get()));

  // Attempt to connect a second time.
  ASSERT_TRUE(CompleteHandshakes(client_.get(), server_.get()));

  // |SSL_clear| should implicitly offer the previous session to the server.
  EXPECT_TRUE(SSL_session_reused(client_.get()));
  EXPECT_TRUE(SSL_session_reused(server_.get()));
}